

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

void __thiscall ON_SHA1::AccumulateFloatArray(ON_SHA1 *this,size_t count,float *a)

{
  float *pfVar1;
  float fVar2;
  undefined7 in_register_00000001;
  float v;
  undefined8 uStack_28;
  
  if ((a != (float *)0x0 && count != 0) && (0 < (long)count)) {
    uStack_28 = CONCAT71(in_register_00000001,count == 0);
    pfVar1 = a + count;
    do {
      fVar2 = *a;
      a = a + 1;
      uStack_28 = CONCAT44(~-(uint)(fVar2 == 0.0) & (uint)fVar2,(undefined4)uStack_28);
      Internal_SwapBigEndianUpdate(this,(void *)((long)&uStack_28 + 4),4);
    } while (a < pfVar1);
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateFloatArray(
  size_t count,
  const float* a
)
{
  if (count > 0 && nullptr != a)
  {
    float x, v;
    const float* a1 = a + count;
    while (a < a1)
    {
      x = *a++;
      v = (0.0f == x ? 0.0f : x);
      Internal_SwapBigEndianUpdate(&v, sizeof(v));
    }
  }
}